

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O0

void IDACompleteStep(IDAMem IDA_mem,sunrealtype err_k,sunrealtype err_km1)

{
  long in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double in_XMM1_Qa;
  N_Vector *tempvS;
  N_Vector tempvQ;
  sunrealtype hnew;
  sunrealtype tmp;
  sunrealtype enorm;
  sunrealtype err_kp1;
  sunrealtype err_knew;
  sunrealtype terr_kp1;
  sunrealtype terr_km1;
  sunrealtype terr_k;
  int action;
  int kdiff;
  int is;
  int j;
  int i;
  undefined8 in_stack_ffffffffffffff48;
  int iVar3;
  N_Vector in_stack_ffffffffffffff50;
  undefined8 uVar4;
  N_Vector in_stack_ffffffffffffff58;
  IDAMem in_stack_ffffffffffffff60;
  IDAMem in_stack_ffffffffffffff68;
  double local_90;
  double local_70;
  sunrealtype local_60;
  double local_58;
  double local_50;
  int local_2c;
  int local_24;
  int local_20;
  int local_1c;
  
  *(long *)(in_RDI + 0x5b8) = *(long *)(in_RDI + 0x5b8) + 1;
  iVar3 = *(int *)(in_RDI + 0x4bc);
  *(undefined4 *)(in_RDI + 0x4bc) = *(undefined4 *)(in_RDI + 0x4b8);
  *(undefined8 *)(in_RDI + 0x4e8) = *(undefined8 *)(in_RDI + 0x4e0);
  if ((*(int *)(in_RDI + 0x4c0) == *(int *)(in_RDI + 0x4b8) + -1) ||
     (*(int *)(in_RDI + 0x4b8) == *(int *)(in_RDI + 0x560))) {
    *(undefined4 *)(in_RDI + 0x4c4) = 1;
  }
  if (*(int *)(in_RDI + 0x4c4) == 0) {
    if (1 < *(long *)(in_RDI + 0x5b8)) {
      *(int *)(in_RDI + 0x4b8) = *(int *)(in_RDI + 0x4b8) + 1;
      local_70 = *(double *)(in_RDI + 0x4e0) * 2.0;
      dVar1 = ABS(local_70) * *(double *)(in_RDI + 0x570);
      if (1.0 < dVar1) {
        local_70 = local_70 / dVar1;
      }
      *(double *)(in_RDI + 0x4e0) = local_70;
    }
  }
  else {
    if (*(int *)(in_RDI + 0x4c0) == *(int *)(in_RDI + 0x4b8) + -1) {
      local_2c = 1;
    }
    else if (*(int *)(in_RDI + 0x4b8) == *(int *)(in_RDI + 0x560)) {
      local_2c = 3;
    }
    else if ((*(int *)(in_RDI + 0x4b8) + 1 < *(int *)(in_RDI + 0x4c8)) &&
            (*(int *)(in_RDI + 0x4b8) - iVar3 != 1)) {
      N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,*(undefined8 *)(in_RDI + 0x2c0),
                   *(undefined8 *)(in_RDI + 0x158 + (long)(*(int *)(in_RDI + 0x4b8) + 1) * 8),
                   *(undefined8 *)(in_RDI + 0x2c8));
      iVar3 = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
      local_60 = IDAWrmsNorm(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                             in_stack_ffffffffffffff50,iVar3);
      if (*(int *)(in_RDI + 0x78) != 0) {
        N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,*(undefined8 *)(in_RDI + 0x348),
                     *(undefined8 *)(in_RDI + 0x300 + (long)(*(int *)(in_RDI + 0x4b8) + 1) * 8),
                     *(undefined8 *)(in_RDI + 0x338));
        local_60 = IDAQuadWrmsNormUpdate
                             (in_stack_ffffffffffffff68,(sunrealtype)in_stack_ffffffffffffff60,
                              in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      }
      if (*(int *)(in_RDI + 0xe8) != 0) {
        N_VLinearSumVectorArray
                  (0x3ff0000000000000,0xbff0000000000000,*(undefined4 *)(in_RDI + 0xa0),
                   *(undefined8 *)(in_RDI + 0x388),
                   *(undefined8 *)(in_RDI + 0x350 + (long)(*(int *)(in_RDI + 0x4b8) + 1) * 8),
                   *(undefined8 *)(in_RDI + 0x398));
        local_60 = IDASensWrmsNormUpdate
                             (in_stack_ffffffffffffff68,(sunrealtype)in_stack_ffffffffffffff60,
                              (N_Vector *)in_stack_ffffffffffffff58,
                              (N_Vector *)in_stack_ffffffffffffff50,iVar3);
      }
      if (*(int *)(in_RDI + 300) != 0) {
        N_VLinearSumVectorArray
                  (0x3ff0000000000000,0xbff0000000000000,*(undefined4 *)(in_RDI + 0xa0),
                   *(undefined8 *)(in_RDI + 0x438),
                   *(undefined8 *)(in_RDI + 0x400 + (long)(*(int *)(in_RDI + 0x4b8) + 1) * 8),
                   *(undefined8 *)(in_RDI + 0x448));
        local_60 = IDAQuadSensWrmsNormUpdate
                             (in_stack_ffffffffffffff68,(sunrealtype)in_stack_ffffffffffffff60,
                              (N_Vector *)in_stack_ffffffffffffff58,
                              (N_Vector *)in_stack_ffffffffffffff50);
      }
      local_58 = local_60 / (double)(*(int *)(in_RDI + 0x4b8) + 2);
      dVar1 = (double)(*(int *)(in_RDI + 0x4b8) + 1) * in_XMM0_Qa;
      dVar2 = (double)(*(int *)(in_RDI + 0x4b8) + 2) * local_58;
      if (*(int *)(in_RDI + 0x4b8) == 1) {
        if (dVar2 < dVar1 * 0.5) {
          local_2c = 2;
        }
        else {
          local_2c = 3;
        }
      }
      else {
        local_90 = dVar2;
        if (dVar1 < dVar2) {
          local_90 = dVar1;
        }
        if (local_90 < (double)*(int *)(in_RDI + 0x4b8) * in_XMM1_Qa) {
          if (dVar2 < dVar1) {
            local_2c = 2;
          }
          else {
            local_2c = 3;
          }
        }
        else {
          local_2c = 1;
        }
      }
    }
    else {
      local_2c = 3;
    }
    if (local_2c == 2) {
      *(int *)(in_RDI + 0x4b8) = *(int *)(in_RDI + 0x4b8) + 1;
      local_50 = local_58;
    }
    else {
      local_50 = in_XMM0_Qa;
      if (local_2c == 1) {
        *(int *)(in_RDI + 0x4b8) = *(int *)(in_RDI + 0x4b8) + -1;
        local_50 = in_XMM1_Qa;
      }
    }
    *(undefined8 *)(in_RDI + 0x4f0) = 0x3ff0000000000000;
    dVar1 = pow(local_50 + local_50 + 0.0001,-1.0 / (double)(*(int *)(in_RDI + 0x4b8) + 1));
    if (dVar1 < *(double *)(in_RDI + 0x580)) {
      if (dVar1 <= *(double *)(in_RDI + 0x588)) {
        if (*(double *)(in_RDI + 0x5a0) <= dVar1) {
          dVar1 = *(double *)(in_RDI + 0x5a0);
        }
        *(double *)(in_RDI + 0x4f0) = dVar1;
        if (*(double *)(in_RDI + 0x4f0) < *(double *)(in_RDI + 0x598) ||
            *(double *)(in_RDI + 0x4f0) == *(double *)(in_RDI + 0x598)) {
          uVar4 = *(undefined8 *)(in_RDI + 0x598);
        }
        else {
          uVar4 = *(undefined8 *)(in_RDI + 0x4f0);
        }
        *(undefined8 *)(in_RDI + 0x4f0) = uVar4;
        if (*(double *)(in_RDI + 0x4f0) <=
            *(double *)(in_RDI + 0x578) / ABS(*(double *)(in_RDI + 0x4e0))) {
          dVar1 = *(double *)(in_RDI + 0x578) / ABS(*(double *)(in_RDI + 0x4e0));
        }
        else {
          dVar1 = *(double *)(in_RDI + 0x4f0);
        }
        *(double *)(in_RDI + 0x4f0) = dVar1;
      }
    }
    else {
      if (*(double *)(in_RDI + 0x590) <= dVar1) {
        dVar1 = *(double *)(in_RDI + 0x590);
      }
      *(double *)(in_RDI + 0x4f0) = dVar1;
      if (1.0 <= *(double *)(in_RDI + 0x4f0) * ABS(*(double *)(in_RDI + 0x4e0)) *
                 *(double *)(in_RDI + 0x570)) {
        dVar1 = *(double *)(in_RDI + 0x4f0) * ABS(*(double *)(in_RDI + 0x4e0)) *
                *(double *)(in_RDI + 0x570);
      }
      else {
        dVar1 = 1.0;
      }
      *(double *)(in_RDI + 0x4f0) = *(double *)(in_RDI + 0x4f0) / dVar1;
    }
    *(double *)(in_RDI + 0x4e0) = *(double *)(in_RDI + 0x4f0) * *(double *)(in_RDI + 0x4e0);
  }
  if (*(int *)(in_RDI + 0x4bc) < *(int *)(in_RDI + 0x560)) {
    N_VScale(0x3ff0000000000000,*(undefined8 *)(in_RDI + 0x2c0),
             *(undefined8 *)(in_RDI + 0x158 + (long)(*(int *)(in_RDI + 0x4bc) + 1) * 8));
    if (*(int *)(in_RDI + 0x60) != 0) {
      N_VScale(0x3ff0000000000000,*(undefined8 *)(in_RDI + 0x348),
               *(undefined8 *)(in_RDI + 0x300 + (long)(*(int *)(in_RDI + 0x4bc) + 1) * 8));
    }
    if ((*(int *)(in_RDI + 0x9c) != 0) || (*(int *)(in_RDI + 0x110) != 0)) {
      for (local_24 = 0; local_24 < *(int *)(in_RDI + 0xa0); local_24 = local_24 + 1) {
        *(undefined8 *)(*(long *)(in_RDI + 0x7f8) + (long)local_24 * 8) = 0x3ff0000000000000;
      }
    }
    if (*(int *)(in_RDI + 0x9c) != 0) {
      N_VScaleVectorArray(*(undefined4 *)(in_RDI + 0xa0),*(undefined8 *)(in_RDI + 0x7f8),
                          *(undefined8 *)(in_RDI + 0x388),
                          *(undefined8 *)(in_RDI + 0x350 + (long)(*(int *)(in_RDI + 0x4bc) + 1) * 8)
                         );
    }
    if (*(int *)(in_RDI + 0x110) != 0) {
      N_VScaleVectorArray(*(undefined4 *)(in_RDI + 0xa0),*(undefined8 *)(in_RDI + 0x7f8),
                          *(undefined8 *)(in_RDI + 0x438),
                          *(undefined8 *)(in_RDI + 0x400 + (long)(*(int *)(in_RDI + 0x4bc) + 1) * 8)
                         );
    }
  }
  **(undefined8 **)(in_RDI + 0x830) = *(undefined8 *)(in_RDI + 0x2c0);
  **(undefined8 **)(in_RDI + 0x828) =
       *(undefined8 *)(in_RDI + 0x158 + (long)*(int *)(in_RDI + 0x4bc) * 8);
  for (local_20 = 1; local_20 <= *(int *)(in_RDI + 0x4bc); local_20 = local_20 + 1) {
    *(undefined8 *)(*(long *)(in_RDI + 0x830) + (long)local_20 * 8) =
         *(undefined8 *)(in_RDI + 0x158 + (long)((*(int *)(in_RDI + 0x4bc) - local_20) + 1) * 8);
    *(undefined8 *)(*(long *)(in_RDI + 0x828) + (long)local_20 * 8) =
         *(undefined8 *)(in_RDI + 0x158 + (long)(*(int *)(in_RDI + 0x4bc) - local_20) * 8);
  }
  N_VLinearSumVectorArray
            (*(int *)(in_RDI + 0x4bc) + 1,*(undefined8 *)(in_RDI + 0x828),
             *(undefined8 *)(in_RDI + 0x830),*(undefined8 *)(in_RDI + 0x828));
  if (*(int *)(in_RDI + 0x60) != 0) {
    **(undefined8 **)(in_RDI + 0x830) = *(undefined8 *)(in_RDI + 0x348);
    **(undefined8 **)(in_RDI + 0x828) =
         *(undefined8 *)(in_RDI + 0x300 + (long)*(int *)(in_RDI + 0x4bc) * 8);
    for (local_20 = 1; local_20 <= *(int *)(in_RDI + 0x4bc); local_20 = local_20 + 1) {
      *(undefined8 *)(*(long *)(in_RDI + 0x830) + (long)local_20 * 8) =
           *(undefined8 *)(in_RDI + 0x300 + (long)((*(int *)(in_RDI + 0x4bc) - local_20) + 1) * 8);
      *(undefined8 *)(*(long *)(in_RDI + 0x828) + (long)local_20 * 8) =
           *(undefined8 *)(in_RDI + 0x300 + (long)(*(int *)(in_RDI + 0x4bc) - local_20) * 8);
    }
    N_VLinearSumVectorArray
              (*(int *)(in_RDI + 0x4bc) + 1,*(undefined8 *)(in_RDI + 0x828),
               *(undefined8 *)(in_RDI + 0x830),*(undefined8 *)(in_RDI + 0x828));
  }
  if (*(int *)(in_RDI + 0x9c) != 0) {
    local_1c = 0;
    for (local_24 = 0; local_24 < *(int *)(in_RDI + 0xa0); local_24 = local_24 + 1) {
      *(undefined8 *)(*(long *)(in_RDI + 0x830) + (long)local_1c * 8) =
           *(undefined8 *)(*(long *)(in_RDI + 0x388) + (long)local_24 * 8);
      *(undefined8 *)(*(long *)(in_RDI + 0x828) + (long)local_1c * 8) =
           *(undefined8 *)
            (*(long *)(in_RDI + 0x350 + (long)*(int *)(in_RDI + 0x4bc) * 8) + (long)local_24 * 8);
      for (local_20 = 1; local_1c = local_1c + 1, local_20 <= *(int *)(in_RDI + 0x4bc);
          local_20 = local_20 + 1) {
        *(undefined8 *)(*(long *)(in_RDI + 0x830) + (long)local_1c * 8) =
             *(undefined8 *)
              (*(long *)(in_RDI + 0x350 + (long)((*(int *)(in_RDI + 0x4bc) - local_20) + 1) * 8) +
              (long)local_24 * 8);
        *(undefined8 *)(*(long *)(in_RDI + 0x828) + (long)local_1c * 8) =
             *(undefined8 *)
              (*(long *)(in_RDI + 0x350 + (long)(*(int *)(in_RDI + 0x4bc) - local_20) * 8) +
              (long)local_24 * 8);
      }
    }
    N_VLinearSumVectorArray
              (*(int *)(in_RDI + 0xa0) * (*(int *)(in_RDI + 0x4bc) + 1),
               *(undefined8 *)(in_RDI + 0x828),*(undefined8 *)(in_RDI + 0x830),
               *(undefined8 *)(in_RDI + 0x828));
  }
  if (*(int *)(in_RDI + 0x110) != 0) {
    local_1c = 0;
    for (local_24 = 0; local_24 < *(int *)(in_RDI + 0xa0); local_24 = local_24 + 1) {
      *(undefined8 *)(*(long *)(in_RDI + 0x830) + (long)local_1c * 8) =
           *(undefined8 *)(*(long *)(in_RDI + 0x438) + (long)local_24 * 8);
      *(undefined8 *)(*(long *)(in_RDI + 0x828) + (long)local_1c * 8) =
           *(undefined8 *)
            (*(long *)(in_RDI + 0x400 + (long)*(int *)(in_RDI + 0x4bc) * 8) + (long)local_24 * 8);
      for (local_20 = 1; local_1c = local_1c + 1, local_20 <= *(int *)(in_RDI + 0x4bc);
          local_20 = local_20 + 1) {
        *(undefined8 *)(*(long *)(in_RDI + 0x830) + (long)local_1c * 8) =
             *(undefined8 *)
              (*(long *)(in_RDI + 0x400 + (long)((*(int *)(in_RDI + 0x4bc) - local_20) + 1) * 8) +
              (long)local_24 * 8);
        *(undefined8 *)(*(long *)(in_RDI + 0x828) + (long)local_1c * 8) =
             *(undefined8 *)
              (*(long *)(in_RDI + 0x400 + (long)(*(int *)(in_RDI + 0x4bc) - local_20) * 8) +
              (long)local_24 * 8);
      }
    }
    N_VLinearSumVectorArray
              (*(int *)(in_RDI + 0xa0) * (*(int *)(in_RDI + 0x4bc) + 1),
               *(undefined8 *)(in_RDI + 0x828),*(undefined8 *)(in_RDI + 0x830),
               *(undefined8 *)(in_RDI + 0x828));
  }
  return;
}

Assistant:

static void IDACompleteStep(IDAMem IDA_mem, sunrealtype err_k, sunrealtype err_km1)
{
  int i, j, is, kdiff, action;
  sunrealtype terr_k, terr_km1, terr_kp1;
  sunrealtype err_knew, err_kp1;
  sunrealtype enorm, tmp, hnew;
  N_Vector tempvQ, *tempvS;

  IDA_mem->ida_nst++;
  kdiff              = IDA_mem->ida_kk - IDA_mem->ida_kused;
  IDA_mem->ida_kused = IDA_mem->ida_kk;
  IDA_mem->ida_hused = IDA_mem->ida_hh;

  if ((IDA_mem->ida_knew == IDA_mem->ida_kk - 1) ||
      (IDA_mem->ida_kk == IDA_mem->ida_maxord))
  {
    IDA_mem->ida_phase = 1;
  }

  /* For the first few steps, until either a step fails, or the order is
     reduced, or the order reaches its maximum, we raise the order and double
     the stepsize. During these steps, phase = 0. Thereafter, phase = 1, and
     stepsize and order are set by the usual local error algorithm.

     Note that, after the first step, the order is not increased, as not all
     of the necessary information is available yet. */

  if (IDA_mem->ida_phase == 0)
  {
    if (IDA_mem->ida_nst > 1)
    {
      IDA_mem->ida_kk++;
      hnew = TWO * IDA_mem->ida_hh;
      if ((tmp = SUNRabs(hnew) * IDA_mem->ida_hmax_inv) > ONE) { hnew /= tmp; }
      IDA_mem->ida_hh = hnew;
    }
  }
  else
  {
    action = UNSET;

    /* Set action = LOWER/MAINTAIN/RAISE to specify order decision */

    if (IDA_mem->ida_knew == IDA_mem->ida_kk - 1)
    {
      /* Already decided to reduce the order */
      action = LOWER;
    }
    else if (IDA_mem->ida_kk == IDA_mem->ida_maxord)
    {
      /* Already using the maximum order */
      action = MAINTAIN;
    }
    else if ((IDA_mem->ida_kk + 1 >= IDA_mem->ida_ns) || (kdiff == 1))
    {
      /* Step size has not been constant or the order was just raised */
      action = MAINTAIN;
    }
    else
    {
      /* Estimate the error at order k+1 */

      N_VLinearSum(ONE, IDA_mem->ida_ee, -ONE,
                   IDA_mem->ida_phi[IDA_mem->ida_kk + 1], IDA_mem->ida_tempv1);
      enorm = IDAWrmsNorm(IDA_mem, IDA_mem->ida_tempv1, IDA_mem->ida_ewt,
                          IDA_mem->ida_suppressalg);

      if (IDA_mem->ida_errconQ)
      {
        tempvQ = IDA_mem->ida_ypQ;
        N_VLinearSum(ONE, IDA_mem->ida_eeQ, -ONE,
                     IDA_mem->ida_phiQ[IDA_mem->ida_kk + 1], tempvQ);
        enorm = IDAQuadWrmsNormUpdate(IDA_mem, enorm, tempvQ, IDA_mem->ida_ewtQ);
      }

      if (IDA_mem->ida_errconS)
      {
        tempvS = IDA_mem->ida_ypS;

        (void)N_VLinearSumVectorArray(IDA_mem->ida_Ns, ONE, IDA_mem->ida_eeS,
                                      -ONE,
                                      IDA_mem->ida_phiS[IDA_mem->ida_kk + 1],
                                      tempvS);

        enorm = IDASensWrmsNormUpdate(IDA_mem, enorm, tempvS, IDA_mem->ida_ewtS,
                                      IDA_mem->ida_suppressalg);
      }

      if (IDA_mem->ida_errconQS)
      {
        (void)N_VLinearSumVectorArray(IDA_mem->ida_Ns, ONE, IDA_mem->ida_eeQS,
                                      -ONE,
                                      IDA_mem->ida_phiQS[IDA_mem->ida_kk + 1],
                                      IDA_mem->ida_tempvQS);

        enorm = IDAQuadSensWrmsNormUpdate(IDA_mem, enorm, IDA_mem->ida_tempvQS,
                                          IDA_mem->ida_ewtQS);
      }

      err_kp1 = enorm / (IDA_mem->ida_kk + 2);

      /* Choose among orders k-1, k, k+1 using local truncation error norms. */

      terr_k   = (IDA_mem->ida_kk + 1) * err_k;
      terr_kp1 = (IDA_mem->ida_kk + 2) * err_kp1;

      if (IDA_mem->ida_kk == 1)
      {
        if (terr_kp1 >= HALF * terr_k) { action = MAINTAIN; }
        else { action = RAISE; }

        SUNLogDebug(IDA_LOGGER, "order-selection-raise",
                    "terr_k = " SUN_FORMAT_G ", terr_kp1 = " SUN_FORMAT_G,
                    terr_k, terr_kp1);
      }
      else
      {
        terr_km1 = IDA_mem->ida_kk * err_km1;
        if (terr_km1 <= SUNMIN(terr_k, terr_kp1)) { action = LOWER; }
        else if (terr_kp1 >= terr_k) { action = MAINTAIN; }
        else { action = RAISE; }

        SUNLogDebug(IDA_LOGGER, "order-selection-rasie-or-lower",
                    "terr_km1 = " SUN_FORMAT_G ", terr_k = " SUN_FORMAT_G
                    ", terr_kp1 = " SUN_FORMAT_G,
                    terr_km1, terr_k, terr_kp1);
      }
    }

    /* Set the estimated error norm and, on change of order, reset kk. */
    if (action == RAISE)
    {
      IDA_mem->ida_kk++;
      err_knew = err_kp1;
    }
    else if (action == LOWER)
    {
      IDA_mem->ida_kk--;
      err_knew = err_km1;
    }
    else { err_knew = err_k; }

    /* Compute tmp = tentative ratio hnew/hh from error norm estimate.
       1. If eta >= eta_max_fx (default = 2), increase hh to at most eta_max
          (default = 2) i.e., double the step size
       2. If eta <= eta_min_fx (default = 1), reduce hh to between eta_min
          (default 0.5) and eta_low (default 0.9),
       3. Otherwise leave hh as is i.e., eta = 1. */

    IDA_mem->ida_eta = ONE;
    tmp = SUNRpowerR(TWO * err_knew + PT0001, -ONE / (IDA_mem->ida_kk + 1));

    if (tmp >= IDA_mem->ida_eta_max_fx)
    {
      /* Enforce max growth factor bound and max step size */
      IDA_mem->ida_eta = SUNMIN(tmp, IDA_mem->ida_eta_max);
      IDA_mem->ida_eta /= SUNMAX(ONE, IDA_mem->ida_eta * SUNRabs(IDA_mem->ida_hh) *
                                        IDA_mem->ida_hmax_inv);
    }
    else if (tmp <= IDA_mem->ida_eta_min_fx)
    {
      /* Enforce required reduction factor bound, min reduction bound, and min
         step size. Note if eta = eta_min_fx = 1 and ida_eta_low < 1 the step
         size is reduced. */
      IDA_mem->ida_eta = SUNMIN(tmp, IDA_mem->ida_eta_low);
      IDA_mem->ida_eta = SUNMAX(IDA_mem->ida_eta, IDA_mem->ida_eta_min);
      IDA_mem->ida_eta = SUNMAX(IDA_mem->ida_eta,
                                IDA_mem->ida_hmin / SUNRabs(IDA_mem->ida_hh));
    }
    IDA_mem->ida_hh *= IDA_mem->ida_eta;

    SUNLogDebug(IDA_LOGGER, "new-step-and-order",
                "knew = %i, err_knew = " SUN_FORMAT_G ", eta = " SUN_FORMAT_G
                ", hnew = " SUN_FORMAT_G,
                IDA_mem->ida_kk, err_knew, IDA_mem->ida_eta, IDA_mem->ida_hh);

  } /* end of phase if block */

  /* Save ee for possible order increase on next step */
  if (IDA_mem->ida_kused < IDA_mem->ida_maxord)
  {
    N_VScale(ONE, IDA_mem->ida_ee, IDA_mem->ida_phi[IDA_mem->ida_kused + 1]);

    if (IDA_mem->ida_quadr)
    {
      N_VScale(ONE, IDA_mem->ida_eeQ, IDA_mem->ida_phiQ[IDA_mem->ida_kused + 1]);
    }

    if (IDA_mem->ida_sensi || IDA_mem->ida_quadr_sensi)
    {
      for (is = 0; is < IDA_mem->ida_Ns; is++) { IDA_mem->ida_cvals[is] = ONE; }
    }

    if (IDA_mem->ida_sensi)
    {
      (void)N_VScaleVectorArray(IDA_mem->ida_Ns, IDA_mem->ida_cvals,
                                IDA_mem->ida_eeS,
                                IDA_mem->ida_phiS[IDA_mem->ida_kused + 1]);
    }

    if (IDA_mem->ida_quadr_sensi)
    {
      (void)N_VScaleVectorArray(IDA_mem->ida_Ns, IDA_mem->ida_cvals,
                                IDA_mem->ida_eeQS,
                                IDA_mem->ida_phiQS[IDA_mem->ida_kused + 1]);
    }
  }

  /* Update phi arrays */

  /* To update phi arrays compute X += Z where                  */
  /* X = [ phi[kused], phi[kused-1], phi[kused-2], ... phi[1] ] */
  /* Z = [ ee,         phi[kused],   phi[kused-1], ... phi[0] ] */

  IDA_mem->ida_Zvecs[0] = IDA_mem->ida_ee;
  IDA_mem->ida_Xvecs[0] = IDA_mem->ida_phi[IDA_mem->ida_kused];
  for (j = 1; j <= IDA_mem->ida_kused; j++)
  {
    IDA_mem->ida_Zvecs[j] = IDA_mem->ida_phi[IDA_mem->ida_kused - j + 1];
    IDA_mem->ida_Xvecs[j] = IDA_mem->ida_phi[IDA_mem->ida_kused - j];
  }

  (void)N_VLinearSumVectorArray(IDA_mem->ida_kused + 1, ONE, IDA_mem->ida_Xvecs,
                                ONE, IDA_mem->ida_Zvecs, IDA_mem->ida_Xvecs);

  if (IDA_mem->ida_quadr)
  {
    IDA_mem->ida_Zvecs[0] = IDA_mem->ida_eeQ;
    IDA_mem->ida_Xvecs[0] = IDA_mem->ida_phiQ[IDA_mem->ida_kused];
    for (j = 1; j <= IDA_mem->ida_kused; j++)
    {
      IDA_mem->ida_Zvecs[j] = IDA_mem->ida_phiQ[IDA_mem->ida_kused - j + 1];
      IDA_mem->ida_Xvecs[j] = IDA_mem->ida_phiQ[IDA_mem->ida_kused - j];
    }

    (void)N_VLinearSumVectorArray(IDA_mem->ida_kused + 1, ONE, IDA_mem->ida_Xvecs,
                                  ONE, IDA_mem->ida_Zvecs, IDA_mem->ida_Xvecs);
  }

  if (IDA_mem->ida_sensi)
  {
    i = 0;
    for (is = 0; is < IDA_mem->ida_Ns; is++)
    {
      IDA_mem->ida_Zvecs[i] = IDA_mem->ida_eeS[is];
      IDA_mem->ida_Xvecs[i] = IDA_mem->ida_phiS[IDA_mem->ida_kused][is];
      i++;
      for (j = 1; j <= IDA_mem->ida_kused; j++)
      {
        IDA_mem->ida_Zvecs[i] = IDA_mem->ida_phiS[IDA_mem->ida_kused - j + 1][is];
        IDA_mem->ida_Xvecs[i] = IDA_mem->ida_phiS[IDA_mem->ida_kused - j][is];
        i++;
      }
    }

    (void)N_VLinearSumVectorArray(IDA_mem->ida_Ns * (IDA_mem->ida_kused + 1),
                                  ONE, IDA_mem->ida_Xvecs, ONE,
                                  IDA_mem->ida_Zvecs, IDA_mem->ida_Xvecs);
  }

  if (IDA_mem->ida_quadr_sensi)
  {
    i = 0;
    for (is = 0; is < IDA_mem->ida_Ns; is++)
    {
      IDA_mem->ida_Zvecs[i] = IDA_mem->ida_eeQS[is];
      IDA_mem->ida_Xvecs[i] = IDA_mem->ida_phiQS[IDA_mem->ida_kused][is];
      i++;
      for (j = 1; j <= IDA_mem->ida_kused; j++)
      {
        IDA_mem->ida_Zvecs[i] = IDA_mem->ida_phiQS[IDA_mem->ida_kused - j + 1][is];
        IDA_mem->ida_Xvecs[i] = IDA_mem->ida_phiQS[IDA_mem->ida_kused - j][is];
        i++;
      }
    }

    (void)N_VLinearSumVectorArray(IDA_mem->ida_Ns * (IDA_mem->ida_kused + 1),
                                  ONE, IDA_mem->ida_Xvecs, ONE,
                                  IDA_mem->ida_Zvecs, IDA_mem->ida_Xvecs);
  }
}